

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O3

bool_t prf_model_vertex_palette_optimize(prf_model_t *model)

{
  ushort uVar1;
  prf_vertex_pool_s **id;
  prf_vertex_pool_s *ppVar2;
  uint8_t *puVar3;
  uint uVar4;
  void *__ptr;
  void *__ptr_00;
  uint *puVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  bool_t bVar10;
  ulong uVar11;
  uint uVar12;
  uint8_t *__src;
  ulong uVar13;
  uint16_t *uint16ptr;
  uint *__src_00;
  long lVar14;
  prf_cb_t callback;
  prf_cb_t callback_00;
  ulong local_70;
  
  uVar8 = *(uint *)model->vertex_palette->data;
  if ((model->vertextras != (prf_vertex_pool_s **)0x0) &&
     (uVar4 = prf_array_count(model->vertextras), 0 < (int)uVar4)) {
    uVar7 = 0;
    do {
      uVar8 = uVar8 + model->vertextras[uVar7]->position;
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  __ptr = calloc(1,(ulong)uVar8);
  if (__ptr == (void *)0x0) {
    bVar10 = 0;
    prf_error(9,"memory allocation error (malloc returned NULL)");
  }
  else {
    callback.data = __ptr;
    callback.func = vt_tag_cb;
    prf_model_traverse_io(model,callback);
    __ptr_00 = malloc((ulong)uVar8);
    if (__ptr_00 == (void *)0x0) {
      bVar10 = 0;
      prf_error(9,"memory allocation error (malloc returned NULL)");
      free(__ptr);
    }
    else {
      puVar5 = (uint *)model->vertex_palette->data;
      uVar8 = *puVar5;
      uVar7 = 0;
      if (8 < uVar8) {
        __src_00 = puVar5 + 2;
        uVar7 = 0;
        lVar14 = 8;
        do {
          if (*(int *)((long)__ptr + lVar14) == 0) {
            uVar13 = (ulong)*(ushort *)((long)__src_00 + 2);
            uVar7 = (ulong)((int)uVar7 + (uint)*(ushort *)((long)__src_00 + 2));
          }
          else {
            uVar13 = (ulong)*(ushort *)((long)__src_00 + 2);
            memcpy((void *)((long)__ptr_00 + (lVar14 - uVar7)),__src_00,uVar13);
            *(int *)((long)__ptr + lVar14) = (int)lVar14 - (int)uVar7;
          }
          __src_00 = (uint *)((long)__src_00 + uVar13);
          lVar14 = (long)__src_00 - (long)puVar5;
        } while ((uint)lVar14 < uVar8);
        uVar8 = *puVar5;
      }
      iVar6 = (int)uVar7;
      if (model->vertextras != (prf_vertex_pool_s **)0x0) {
        uVar4 = prf_array_count(model->vertextras);
        id = model->vertextras;
        if (0 < (int)uVar4) {
          uVar13 = 0;
          do {
            local_70 = (ulong)uVar8;
            ppVar2 = id[uVar13];
            uVar12 = ppVar2->position;
            if (uVar12 == 0) {
              uVar12 = 0;
            }
            else {
              puVar3 = ppVar2->data;
              uVar11 = 0;
              do {
                __src = puVar3 + uVar11;
                if (*(int *)((long)__ptr + uVar11 + local_70) == 0) {
                  uVar1 = *(ushort *)(__src + 2);
                  uVar7 = (ulong)((int)uVar7 + (uint)uVar1);
                }
                else {
                  uVar12 = (int)uVar11 + uVar8;
                  uVar1 = *(ushort *)(__src + 2);
                  memcpy((void *)((long)__ptr_00 + (uVar12 - uVar7)),__src,(ulong)uVar1);
                  *(uint *)((long)__ptr + (ulong)uVar12) = uVar12 - (int)uVar7;
                  uVar12 = ppVar2->position;
                }
                uVar9 = (int)uVar11 + (uint)uVar1;
                uVar11 = (ulong)uVar9;
              } while (uVar9 < uVar12);
            }
            iVar6 = (int)uVar7;
            uVar8 = uVar12 + uVar8;
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar4);
        }
        if (id != (prf_vertex_pool_s **)0x0) {
          uVar4 = prf_array_count(id);
          if (0 < (int)uVar4) {
            uVar7 = 0;
            do {
              free(model->vertextras[uVar7]->data);
              free(model->vertextras[uVar7]);
              uVar7 = uVar7 + 1;
            } while (uVar4 != uVar7);
          }
          prf_array_free(model->vertextras);
          model->vertextras = (prf_vertex_pool_s **)0x0;
        }
      }
      uVar8 = uVar8 - iVar6;
      puVar5 = (uint *)model->vertex_palette->data;
      if (model->mempool_id == 0) {
        free(puVar5);
        puVar5 = (uint *)realloc(__ptr_00,(ulong)uVar8);
        model->vertex_palette->data = (uint8_t *)puVar5;
      }
      else {
        if (*puVar5 < uVar8) {
          puVar5 = (uint *)pool_malloc(model->mempool_id,uVar8);
          model->vertex_palette->data = (uint8_t *)puVar5;
        }
        memcpy(puVar5,__ptr_00,(ulong)uVar8);
        free(__ptr_00);
        puVar5 = (uint *)model->vertex_palette->data;
      }
      *puVar5 = uVar8;
      callback_00.data = __ptr;
      callback_00.func = vt_fix_cb;
      prf_model_traverse_io(model,callback_00);
      free(__ptr);
      bVar10 = 1;
    }
  }
  return bVar10;
}

Assistant:

bool_t
prf_model_vertex_palette_optimize(
    prf_model_t * model )
{
    prf_cb_t tag_cb, fix_cb;

    uint32_t length = 0;
    uint8_t * rlt = NULL;

    assert( model != NULL && model->vertex_palette != NULL );

    do { /* create vertex list pool */
        length = ((uint32_t *)(model->vertex_palette->data))[0];
        if ( model->vertextras != NULL ) {
            int i, count;
            count = prf_array_count( model->vertextras );
            for ( i = 0; i < count; i++ )
                length += model->vertextras[i]->position;
        }
        rlt = (uint8_t *)malloc( length );
        if ( rlt == NULL ) {
            prf_error( 9, "memory allocation error (malloc returned NULL)" );
            return FALSE;
        }
        memset( rlt, 0, length );
    } while ( FALSE );

    do { /* traverse and tag vertices */
        prf_cb_func( tag_cb, vt_tag_cb );
        prf_cb_data( tag_cb, rlt );
        prf_model_traverse_io( model, tag_cb );
    } while ( FALSE );

    do { /* compact vertex list and create reverse lookup table */
        uint32_t offset = 0;
        uint32_t datasize = 0;
        uint32_t orig_length = 0;
        uint8_t * ptr = NULL, * origdata = NULL;
        uint8_t * buffer = (uint8_t *)malloc( length );

        if ( buffer == NULL ) {
            prf_error( 9, "memory allocation error (malloc returned NULL)" );
            free( rlt );
            return FALSE;
        }

        origdata = model->vertex_palette->data;
        datasize = ((uint32_t *)(origdata))[0];
       
        /* node for node, check if tagged, and update move offset */
        ptr = origdata + 8;
        while ( ((unsigned int) (ptr - origdata)) < datasize ) {
            uint16_t * uint16ptr = (uint16_t *) ptr;
            if ( ((uint32_t *)(rlt+(ptr-origdata)))[0] != 0 ) {
                /* vertex is in use, move vertex into new buffer */
                memmove( buffer + (ptr-origdata) - offset, ptr, uint16ptr[1] );
                /* set reverse lookup index in rtl table */
                ((uint32_t *)(rlt+(ptr-origdata)))[0] = (ptr-origdata) - offset;
            } else {
                /* vertex not in use => accumulate offset */
                offset += uint16ptr[1]; /* add node length to offset */
            }
            ptr += uint16ptr[1];
        }
        orig_length = ((uint32_t *)(origdata))[0];
        if ( model->vertextras != NULL ) {
            int num, i;
            num = prf_array_count( model->vertextras );
            for ( i = 0; i < num; i++ ) {
                unsigned int pos = 0;
                prf_vertex_pool_t * pool = model->vertextras[i];
                while ( pos < pool->position ) {
                     uint16_t * uint16ptr = (uint16_t *) (pool->data + pos);
                     if ( ((uint32_t *)(rlt + orig_length + pos))[0] != 0 ) {
                         /* vertex in use, move vertex to buffer */
                         memmove( buffer + (orig_length + pos) - offset,
                             uint16ptr, uint16ptr[1] );
                         /* create reverse lookup */
                         ((uint32_t *)(rlt + (orig_length+pos)))[0] =
                                (orig_length+pos) - offset;
                     } else {
                         /* vertex not in use, accumulate offset */
                         offset += uint16ptr[1];
                     }
                     pos += uint16ptr[1];
                }
                orig_length += pool->position;
            }
        }

        /* move buffer back into model with vertextras */
        if ( model->vertextras != NULL ) {
            int i, count = prf_array_count( model->vertextras );
            for ( i = 0; i < count; i++ ) {
                free( model->vertextras[i]->data );
                free( model->vertextras[i] );
            }
            prf_array_free( model->vertextras );
            model->vertextras = NULL;
        }

        if ( model->mempool_id == 0 ) {
            free( model->vertex_palette->data );
            model->vertex_palette->data = 
	      (uint8_t *)realloc( buffer, orig_length-offset );
        } else {
            if ( ((uint32_t *)model->vertex_palette->data)[0] >=
                 (orig_length - offset) ) {
                memcpy( model->vertex_palette->data, buffer,
                    orig_length - offset );
            } else {
                /* some memory is wasted here until memory pool is freed */
	      model->vertex_palette->data = (uint8_t *)
                    pool_malloc( model->mempool_id, orig_length - offset );
                memcpy( model->vertex_palette->data, buffer,
                    orig_length - offset );
            }
            free( buffer );
        }
        ((uint32_t *)model->vertex_palette->data)[0] = orig_length - offset;
    } while ( FALSE );

    do { /* traverse and fix vertex list offsets */
        prf_cb_func( fix_cb, vt_fix_cb );
        prf_cb_data( fix_cb, rlt );
        prf_model_traverse_io( model, fix_cb );
        free( rlt );
    } while ( FALSE );

    return TRUE;
}